

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall cmFindPackageCommand::FillPrefixesCMakeSystemVariable(cmFindPackageCommand *this)

{
  long lVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  size_t __n;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  mapped_type *this_00;
  cmValue cVar8;
  string *psVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pcVar11;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  long install_prefix_count;
  string install_path_to_remove;
  string debugBuffer;
  undefined1 local_d8 [32];
  long local_b8;
  undefined1 *local_b0;
  size_t local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::CMakeSystem);
  pcVar3 = (this->super_cmFindCommon).Makefile;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"CMAKE_FIND_NO_INSTALL_PREFIX","");
  bVar5 = cmMakefile::IsOn(pcVar3,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  bVar2 = (this->super_cmFindCommon).NoCMakeInstallPath;
  if (bVar2 == false) {
    pcVar3 = (this->super_cmFindCommon).Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CMAKE_FIND_USE_INSTALL_PREFIX","");
    bVar6 = cmMakefile::IsDefinitionSet(pcVar3,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar6 = false;
  }
  local_b8 = -1;
  local_b0 = &local_a0;
  local_a8 = 0;
  local_a0 = 0;
  pcVar3 = (this->super_cmFindCommon).Makefile;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT","");
  cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if (cVar8.Value != (string *)0x0) {
    cmStrToLong(cVar8.Value,&local_b8);
  }
  pcVar3 = (this->super_cmFindCommon).Makefile;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE","");
  cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if (cVar8.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_b0);
  }
  if (((bVar2 == false) || (local_b8 < 1 || bVar5)) || (local_a8 == 0)) {
    pcVar11 = local_d8 + 0x10;
    local_d8._0_8_ = pcVar11;
    if ((bVar5 & bVar6) == 1) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CMAKE_INSTALL_PREFIX","");
      cmSearchPath::AddCMakePath(this_00,(string *)local_d8);
      if ((pointer)local_d8._0_8_ != pcVar11) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
      local_d8._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"CMAKE_SYSTEM_PREFIX_PATH","");
      cmSearchPath::AddCMakePath(this_00,(string *)local_d8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"CMAKE_SYSTEM_PREFIX_PATH","");
      cmSearchPath::AddCMakePath(this_00,(string *)local_d8);
    }
    if ((pointer)local_d8._0_8_ != pcVar11) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  else {
    pcVar3 = (this->super_cmFindCommon).Makefile;
    local_d8._0_8_ = (string *)(local_d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"CMAKE_SYSTEM_PREFIX_PATH","");
    psVar9 = (string *)cmMakefile::GetDefinition(pcVar3,(string *)local_d8);
    if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if (psVar9 == (string *)0x0) {
      psVar9 = &cmValue::Empty_abi_cxx11_;
    }
    arg._M_str = (psVar9->_M_dataplus)._M_p;
    arg._M_len = psVar9->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d8,arg,false);
    uVar4 = local_d8._8_8_;
    if (local_d8._0_8_ != local_d8._8_8_) {
      lVar10 = 0;
      psVar9 = (string *)local_d8._0_8_;
      do {
        __n = psVar9->_M_string_length;
        if (__n == local_a8) {
          if (__n == 0) {
            bVar5 = true;
          }
          else {
            iVar7 = bcmp((psVar9->_M_dataplus)._M_p,local_b0,__n);
            bVar5 = iVar7 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        lVar1 = lVar10 + 1;
        if ((!bVar5) || (lVar10 = lVar1, lVar1 != local_b8)) {
          cmSearchPath::AddPath(this_00,psVar9);
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != (string *)uVar4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  }
  pcVar11 = local_d8 + 0x10;
  local_d8._0_8_ = pcVar11;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"CMAKE_SYSTEM_FRAMEWORK_PATH","");
  cmSearchPath::AddCMakePath(this_00,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar11) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pcVar11;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"CMAKE_SYSTEM_APPBUNDLE_PATH","");
  cmSearchPath::AddCMakePath(this_00,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar11) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "CMake variables defined in the Platform file [CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n",
               "");
    anon_unknown.dwarf_99e164::collectPathsForDebug(&local_90,this_00,0);
    local_d8._8_8_ = (this->DebugBuffer)._M_dataplus._M_p;
    local_d8._0_8_ = (this->DebugBuffer)._M_string_length;
    local_d8._16_8_ = local_90._M_string_length;
    local_d8._24_8_ = local_90._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)local_d8;
    cmCatViews_abi_cxx11_(&local_50,views);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeSystemVariable()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeSystem];

  const bool install_prefix_in_list =
    !this->Makefile->IsOn("CMAKE_FIND_NO_INSTALL_PREFIX");
  const bool remove_install_prefix = this->NoCMakeInstallPath;
  const bool add_install_prefix = !this->NoCMakeInstallPath &&
    this->Makefile->IsDefinitionSet("CMAKE_FIND_USE_INSTALL_PREFIX");

  // We have 3 possible states for `CMAKE_SYSTEM_PREFIX_PATH` and
  // `CMAKE_INSTALL_PREFIX`.
  // Either we need to remove `CMAKE_INSTALL_PREFIX`, add
  // `CMAKE_INSTALL_PREFIX`, or do nothing.
  //
  // When we need to remove `CMAKE_INSTALL_PREFIX` we remove the Nth occurrence
  // of `CMAKE_INSTALL_PREFIX` from `CMAKE_SYSTEM_PREFIX_PATH`, where `N` is
  // computed by `CMakeSystemSpecificInformation.cmake` while constructing
  // `CMAKE_SYSTEM_PREFIX_PATH`. This ensures that if projects / toolchains
  // have removed `CMAKE_INSTALL_PREFIX` from the list, we don't remove
  // some other entry by mistake
  long install_prefix_count = -1;
  std::string install_path_to_remove;
  if (cmValue to_skip = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT")) {
    cmStrToLong(to_skip, &install_prefix_count);
  }
  if (cmValue install_value = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE")) {
    install_path_to_remove = *install_value;
  }

  if (remove_install_prefix && install_prefix_in_list &&
      install_prefix_count > 0 && !install_path_to_remove.empty()) {

    cmValue prefix_paths =
      this->Makefile->GetDefinition("CMAKE_SYSTEM_PREFIX_PATH");
    // remove entry from CMAKE_SYSTEM_PREFIX_PATH
    std::vector<std::string> expanded = cmExpandedList(*prefix_paths);
    long count = 0;
    for (const auto& path : expanded) {
      bool const to_add =
        !(path == install_path_to_remove && ++count == install_prefix_count);
      if (to_add) {
        paths.AddPath(path);
      }
    }
  } else if (add_install_prefix && !install_prefix_in_list) {
    paths.AddCMakePath("CMAKE_INSTALL_PREFIX");
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  } else {
    // Otherwise the current setup of `CMAKE_SYSTEM_PREFIX_PATH` is correct
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  }

  paths.AddCMakePath("CMAKE_SYSTEM_FRAMEWORK_PATH");
  paths.AddCMakePath("CMAKE_SYSTEM_APPBUNDLE_PATH");

  if (this->DebugMode) {
    std::string debugBuffer = "CMake variables defined in the Platform file "
                              "[CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}